

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O2

void __thiscall
amrex::AmrMesh::InitAmrMesh
          (AmrMesh *this,int max_level_in,Vector<int,_std::allocator<int>_> *n_cell_in,
          Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *a_refrat,RealBox *rb,int coord,
          int *is_per)

{
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *this_00;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *this_01;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *this_02;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *this_03;
  bool bVar1;
  undefined4 uVar2;
  pointer pIVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  undefined8 *puVar7;
  ostream *os_;
  uint uVar8;
  long lVar9;
  pointer pIVar10;
  long lVar11;
  ulong uVar12;
  int *piVar13;
  ulong uVar14;
  size_type sVar15;
  long lVar16;
  Vector<int,_std::allocator<int>_> ratios_vect;
  ParmParse pp;
  Vector<int,_std::allocator<int>_> neb;
  Vector<int,_std::allocator<int>_> ratios;
  
  std::__cxx11::string::string((string *)&neb,"amr",(allocator *)&ratios_vect);
  ParmParse::ParmParse(&pp,(string *)&neb);
  std::__cxx11::string::~string((string *)&neb);
  ParmParse::queryAdd<int,_0>(&pp,"v",&(this->super_AmrInfo).verbose);
  piVar13 = &(this->super_AmrInfo).max_level;
  if (max_level_in == -1) {
    ParmParse::get(&pp,"max_level",piVar13,0);
    max_level_in = *piVar13;
  }
  else {
    *piVar13 = max_level_in;
  }
  this_00 = &(this->super_AmrInfo).blocking_factor;
  sVar15 = (size_type)(max_level_in + 1);
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            (&this_00->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,sVar15);
  this_01 = &(this->super_AmrInfo).max_grid_size;
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            (&this_01->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,sVar15);
  this_02 = &(this->super_AmrInfo).n_error_buf;
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            (&this_02->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,sVar15);
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::resize
            (&(this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,sVar15);
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::resize
            (&(this->dmap).
              super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,
             sVar15);
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::resize
            (&(this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,sVar15);
  lVar9 = 8;
  for (lVar11 = 0; lVar11 <= max_level_in; lVar11 = lVar11 + 1) {
    pIVar10 = (this_02->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start;
    *(undefined8 *)((long)pIVar10->vect + lVar9 + -8) = 0x100000001;
    *(undefined4 *)((long)pIVar10->vect + lVar9) = 1;
    pIVar10 = (this_00->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start;
    *(undefined8 *)((long)pIVar10->vect + lVar9 + -8) = 0x800000008;
    *(undefined4 *)((long)pIVar10->vect + lVar9) = 8;
    pIVar10 = (this_01->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start;
    *(undefined8 *)((long)pIVar10->vect + lVar9 + -8) = 0x2000000020;
    *(undefined4 *)((long)pIVar10->vect + lVar9) = 0x20;
    lVar9 = lVar9 + 0xc;
  }
  this_03 = &(this->super_AmrInfo).ref_ratio;
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            (&this_03->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,
             (long)(this->super_AmrInfo).max_level);
  lVar9 = 8;
  for (lVar11 = 0; lVar11 < (this->super_AmrInfo).max_level; lVar11 = lVar11 + 1) {
    pIVar10 = (this_03->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start;
    *(undefined1 **)((long)pIVar10->vect + lVar9 + -8) = &DAT_200000002;
    *(undefined4 *)((long)pIVar10->vect + lVar9) = 2;
    lVar9 = lVar9 + 0xc;
  }
  ParmParse::queryAdd<int,_0>(&pp,"n_proper",&(this->super_AmrInfo).n_proper);
  ParmParse::queryAdd<double,_0>(&pp,"grid_eff",&(this->super_AmrInfo).grid_eff);
  uVar4 = ParmParse::countval(&pp,"n_error_buf",-1);
  if (0 < (int)uVar4) {
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    uVar12 = 0;
    ParmParse::getarr(&pp,"n_error_buf",&neb.super_vector<int,_std::allocator<int>_>,0,-1);
    iVar5 = (this->super_AmrInfo).max_level;
    uVar8 = iVar5 + 1;
    if ((int)uVar4 <= (int)uVar8) {
      uVar8 = uVar4;
    }
    uVar14 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar14 = uVar12;
    }
    lVar9 = 8;
    for (; uVar14 != uVar12; uVar12 = uVar12 + 1) {
      uVar2 = *(undefined4 *)
               (CONCAT44(neb.super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         (int)neb.super_vector<int,_std::allocator<int>_>.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) + uVar12 * 4);
      pIVar10 = (this_02->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start;
      *(undefined4 *)((long)pIVar10->vect + lVar9 + -8) = uVar2;
      *(undefined4 *)((long)pIVar10->vect + lVar9 + -4) = uVar2;
      *(undefined4 *)((long)pIVar10->vect + lVar9) = uVar2;
      lVar9 = lVar9 + 0xc;
    }
    uVar14 = (ulong)uVar4;
    uVar12 = (long)iVar5 + 1;
    if ((long)uVar14 <= (long)uVar12) {
      uVar12 = uVar14;
    }
    lVar9 = uVar12 * 0xc + 8;
    for (; (long)uVar12 <= (long)(this->super_AmrInfo).max_level; uVar12 = uVar12 + 1) {
      uVar2 = *(undefined4 *)
               (CONCAT44(neb.super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         (int)neb.super_vector<int,_std::allocator<int>_>.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) + -4 + uVar14 * 4);
      pIVar10 = (this_02->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start;
      *(undefined4 *)((long)pIVar10->vect + lVar9 + -8) = uVar2;
      *(undefined4 *)((long)pIVar10->vect + lVar9 + -4) = uVar2;
      *(undefined4 *)((long)pIVar10->vect + lVar9) = uVar2;
      lVar9 = lVar9 + 0xc;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&neb);
  }
  uVar4 = ParmParse::countval(&pp,"n_error_buf_x",-1);
  if (0 < (int)uVar4) {
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    uVar12 = 0;
    ParmParse::getarr(&pp,"n_error_buf_x",&neb.super_vector<int,_std::allocator<int>_>,0,-1);
    iVar5 = (this->super_AmrInfo).max_level;
    uVar8 = iVar5 + 1;
    if ((int)uVar4 <= (int)uVar8) {
      uVar8 = uVar4;
    }
    pIVar10 = (this->super_AmrInfo).n_error_buf.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar14 = 0;
    if (0 < (int)uVar8) {
      uVar14 = (ulong)uVar8;
    }
    for (; uVar14 != uVar12; uVar12 = uVar12 + 1) {
      pIVar10->vect[0] =
           *(int *)(CONCAT44(neb.super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             (int)neb.super_vector<int,_std::allocator<int>_>.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) + uVar12 * 4);
      pIVar10 = pIVar10 + 1;
    }
    uVar12 = (long)iVar5 + 1;
    if ((long)(ulong)uVar4 <= (long)uVar12) {
      uVar12 = (ulong)uVar4;
    }
    pIVar10 = (this_02->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start + uVar12;
    for (; (long)uVar12 <= (long)(this->super_AmrInfo).max_level; uVar12 = uVar12 + 1) {
      pIVar10->vect[0] =
           *(int *)(CONCAT44(neb.super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             (int)neb.super_vector<int,_std::allocator<int>_>.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) + -4 + (long)(int)uVar8 * 4);
      pIVar10 = pIVar10 + 1;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&neb);
  }
  uVar4 = ParmParse::countval(&pp,"n_error_buf_y",-1);
  if (0 < (int)uVar4) {
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    uVar12 = 0;
    ParmParse::getarr(&pp,"n_error_buf_y",&neb.super_vector<int,_std::allocator<int>_>,0,-1);
    iVar5 = (this->super_AmrInfo).max_level;
    uVar8 = iVar5 + 1;
    if ((int)uVar4 <= (int)uVar8) {
      uVar8 = uVar4;
    }
    uVar14 = 0;
    if (0 < (int)uVar8) {
      uVar14 = (ulong)uVar8;
    }
    piVar13 = ((this->super_AmrInfo).n_error_buf.
               super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
               super__Vector_impl_data._M_start)->vect + 1;
    for (; uVar14 != uVar12; uVar12 = uVar12 + 1) {
      *piVar13 = *(int *)(CONCAT44(neb.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   (int)neb.super_vector<int,_std::allocator<int>_>.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) + uVar12 * 4);
      piVar13 = piVar13 + 3;
    }
    uVar12 = (long)iVar5 + 1;
    if ((long)(ulong)uVar4 <= (long)uVar12) {
      uVar12 = (ulong)uVar4;
    }
    piVar13 = (this_02->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12].vect + 1;
    for (; (long)uVar12 <= (long)(this->super_AmrInfo).max_level; uVar12 = uVar12 + 1) {
      *piVar13 = *(int *)(CONCAT44(neb.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   (int)neb.super_vector<int,_std::allocator<int>_>.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) + -4 +
                         (long)(int)uVar8 * 4);
      piVar13 = piVar13 + 3;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&neb);
  }
  uVar4 = ParmParse::countval(&pp,"n_error_buf_z",-1);
  if (0 < (int)uVar4) {
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    uVar12 = 0;
    ParmParse::getarr(&pp,"n_error_buf_z",&neb.super_vector<int,_std::allocator<int>_>,0,-1);
    iVar5 = (this->super_AmrInfo).max_level;
    uVar8 = iVar5 + 1;
    if ((int)uVar4 <= (int)uVar8) {
      uVar8 = uVar4;
    }
    uVar14 = 0;
    if (0 < (int)uVar8) {
      uVar14 = (ulong)uVar8;
    }
    piVar13 = ((this->super_AmrInfo).n_error_buf.
               super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
               super__Vector_impl_data._M_start)->vect + 2;
    for (; uVar14 != uVar12; uVar12 = uVar12 + 1) {
      *piVar13 = *(int *)(CONCAT44(neb.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   (int)neb.super_vector<int,_std::allocator<int>_>.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) + uVar12 * 4);
      piVar13 = piVar13 + 3;
    }
    uVar12 = (long)iVar5 + 1;
    if ((long)(ulong)uVar4 <= (long)uVar12) {
      uVar12 = (ulong)uVar4;
    }
    piVar13 = (this_02->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12].vect + 2;
    for (; (long)uVar12 <= (long)(this->super_AmrInfo).max_level; uVar12 = uVar12 + 1) {
      *piVar13 = *(int *)(CONCAT44(neb.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   (int)neb.super_vector<int,_std::allocator<int>_>.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) + -4 +
                         (long)(int)uVar8 * 4);
      piVar13 = piVar13 + 3;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&neb);
  }
  uVar4 = (this->super_AmrInfo).max_level;
  if (0 < (int)uVar4) {
    sVar15 = (ulong)uVar4 * 3;
    std::vector<int,_std::allocator<int>_>::vector
              (&ratios_vect.super_vector<int,_std::allocator<int>_>,sVar15,(allocator_type *)&neb);
    iVar5 = ParmParse::queryarr(&pp,"ref_ratio_vect",
                                &ratios_vect.super_vector<int,_std::allocator<int>_>,0,(int)sVar15);
    ratios.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ratios.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ratios.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar6 = ParmParse::queryarr(&pp,"ref_ratio",&ratios.super_vector<int,_std::allocator<int>_>,0,-1
                               );
    if (iVar5 == 1 && iVar6 == 1) {
      Abort_host("Only input *either* ref_ratio or ref_ratio_vect");
    }
    else if (iVar5 == 1) {
      pIVar10 = (this_03->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar11 = 0;
      for (lVar9 = 0; lVar9 < (this->super_AmrInfo).max_level; lVar9 = lVar9 + 1) {
        for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
          pIVar10->vect[lVar16] =
               *(int *)(CONCAT44(ratios_vect.super_vector<int,_std::allocator<int>_>.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,
                                 ratios_vect.super_vector<int,_std::allocator<int>_>.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._0_4_) + (long)(int)lVar11 * 4 +
                       lVar16 * 4);
        }
        lVar11 = (long)(int)lVar11 + 3;
        pIVar10 = pIVar10 + 1;
      }
    }
    else if (iVar6 == 1) {
      pIVar10 = (this_03->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar9 = (long)(int)((ulong)((long)ratios.super_vector<int,_std::allocator<int>_>.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                 (long)ratios.super_vector<int,_std::allocator<int>_>.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start) >> 2);
      for (lVar11 = 0; (iVar5 = (this->super_AmrInfo).max_level, lVar11 < lVar9 && (lVar11 < iVar5))
          ; lVar11 = lVar11 + 1) {
        for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
          pIVar10->vect[lVar16] =
               ratios.super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar11];
        }
        pIVar10 = pIVar10 + 1;
      }
      pIVar10 = (this_03->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start + lVar9;
      for (; lVar9 < iVar5; lVar9 = lVar9 + 1) {
        for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
          pIVar10->vect[lVar11] =
               ratios.super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish[-1];
        }
        iVar5 = (this->super_AmrInfo).max_level;
        pIVar10 = pIVar10 + 1;
      }
    }
    else if ((this->super_AmrInfo).verbose != 0) {
      os_ = OutStream();
      Print::Print((Print *)&neb,os_);
      std::operator<<((ostream *)
                      &neb.super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_end_of_storage,"Using default ref_ratio = 2 at all levels\n");
      Print::~Print((Print *)&neb);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&ratios);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&ratios_vect);
  }
  pIVar10 = (a_refrat->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pIVar3 = (a_refrat->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pIVar10 != pIVar3 && -1 < (long)pIVar10 - (long)pIVar3) {
    lVar9 = 0;
    for (lVar11 = 0; lVar11 < (this->super_AmrInfo).max_level; lVar11 = lVar11 + 1) {
      pIVar10 = (a_refrat->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start;
      pIVar3 = (this_03->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(undefined4 *)((long)pIVar3->vect + lVar9 + 8) =
           *(undefined4 *)((long)pIVar10->vect + lVar9 + 8);
      *(undefined8 *)((long)pIVar3->vect + lVar9) = *(undefined8 *)((long)pIVar10->vect + lVar9);
      lVar9 = lVar9 + 0xc;
    }
  }
  iVar5 = ParmParse::countval(&pp,"max_grid_size",-1);
  if (0 < iVar5) {
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    ParmParse::getarr(&pp,"max_grid_size",&neb.super_vector<int,_std::allocator<int>_>,0,-1);
    ratios_vect.super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start._0_4_ =
         *(undefined4 *)
          (CONCAT44(neb.super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish._4_4_,
                    (int)neb.super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish) + -4);
    std::vector<int,_std::allocator<int>_>::resize
              (&neb.super_vector<int,_std::allocator<int>_>,
               (long)(this->super_AmrInfo).max_level + 1,(value_type_conflict *)&ratios_vect);
    SetMaxGridSize(this,&neb);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&neb);
  }
  uVar4 = ParmParse::countval(&pp,"max_grid_size_x",-1);
  if (0 < (int)uVar4) {
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    uVar12 = 0;
    ParmParse::getarr(&pp,"max_grid_size_x",&neb.super_vector<int,_std::allocator<int>_>,0,-1);
    iVar5 = (this->super_AmrInfo).max_level;
    uVar8 = iVar5 + 1;
    if ((int)uVar4 <= (int)uVar8) {
      uVar8 = uVar4;
    }
    pIVar10 = (this->super_AmrInfo).max_grid_size.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar14 = 0;
    if (0 < (int)uVar8) {
      uVar14 = (ulong)uVar8;
    }
    for (; uVar14 != uVar12; uVar12 = uVar12 + 1) {
      pIVar10->vect[0] =
           *(int *)(CONCAT44(neb.super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             (int)neb.super_vector<int,_std::allocator<int>_>.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) + uVar12 * 4);
      pIVar10 = pIVar10 + 1;
    }
    uVar12 = (long)iVar5 + 1;
    if ((long)(ulong)uVar4 <= (long)uVar12) {
      uVar12 = (ulong)uVar4;
    }
    pIVar10 = (this_01->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start + uVar12;
    for (; (long)uVar12 <= (long)(this->super_AmrInfo).max_level; uVar12 = uVar12 + 1) {
      pIVar10->vect[0] =
           *(int *)(CONCAT44(neb.super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             (int)neb.super_vector<int,_std::allocator<int>_>.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) + -4 + (long)(int)uVar8 * 4);
      pIVar10 = pIVar10 + 1;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&neb);
  }
  uVar4 = ParmParse::countval(&pp,"max_grid_size_y",-1);
  if (0 < (int)uVar4) {
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    uVar12 = 0;
    ParmParse::getarr(&pp,"max_grid_size_y",&neb.super_vector<int,_std::allocator<int>_>,0,-1);
    iVar5 = (this->super_AmrInfo).max_level;
    uVar8 = iVar5 + 1;
    if ((int)uVar4 <= (int)uVar8) {
      uVar8 = uVar4;
    }
    uVar14 = 0;
    if (0 < (int)uVar8) {
      uVar14 = (ulong)uVar8;
    }
    piVar13 = ((this->super_AmrInfo).max_grid_size.
               super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
               super__Vector_impl_data._M_start)->vect + 1;
    for (; uVar14 != uVar12; uVar12 = uVar12 + 1) {
      *piVar13 = *(int *)(CONCAT44(neb.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   (int)neb.super_vector<int,_std::allocator<int>_>.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) + uVar12 * 4);
      piVar13 = piVar13 + 3;
    }
    uVar12 = (long)iVar5 + 1;
    if ((long)(ulong)uVar4 <= (long)uVar12) {
      uVar12 = (ulong)uVar4;
    }
    piVar13 = (this_01->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12].vect + 1;
    for (; (long)uVar12 <= (long)(this->super_AmrInfo).max_level; uVar12 = uVar12 + 1) {
      *piVar13 = *(int *)(CONCAT44(neb.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   (int)neb.super_vector<int,_std::allocator<int>_>.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) + -4 +
                         (long)(int)uVar8 * 4);
      piVar13 = piVar13 + 3;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&neb);
  }
  uVar4 = ParmParse::countval(&pp,"max_grid_size_z",-1);
  if (0 < (int)uVar4) {
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    uVar12 = 0;
    ParmParse::getarr(&pp,"max_grid_size_z",&neb.super_vector<int,_std::allocator<int>_>,0,-1);
    iVar5 = (this->super_AmrInfo).max_level;
    uVar8 = iVar5 + 1;
    if ((int)uVar4 <= (int)uVar8) {
      uVar8 = uVar4;
    }
    uVar14 = 0;
    if (0 < (int)uVar8) {
      uVar14 = (ulong)uVar8;
    }
    piVar13 = ((this->super_AmrInfo).max_grid_size.
               super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
               super__Vector_impl_data._M_start)->vect + 2;
    for (; uVar14 != uVar12; uVar12 = uVar12 + 1) {
      *piVar13 = *(int *)(CONCAT44(neb.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   (int)neb.super_vector<int,_std::allocator<int>_>.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) + uVar12 * 4);
      piVar13 = piVar13 + 3;
    }
    uVar12 = (long)iVar5 + 1;
    if ((long)(ulong)uVar4 <= (long)uVar12) {
      uVar12 = (ulong)uVar4;
    }
    piVar13 = (this_01->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12].vect + 2;
    for (; (long)uVar12 <= (long)(this->super_AmrInfo).max_level; uVar12 = uVar12 + 1) {
      *piVar13 = *(int *)(CONCAT44(neb.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   (int)neb.super_vector<int,_std::allocator<int>_>.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) + -4 +
                         (long)(int)uVar8 * 4);
      piVar13 = piVar13 + 3;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&neb);
  }
  iVar5 = ParmParse::countval(&pp,"blocking_factor",-1);
  if (0 < iVar5) {
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    ParmParse::getarr(&pp,"blocking_factor",&neb.super_vector<int,_std::allocator<int>_>,0,-1);
    ratios_vect.super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start._0_4_ =
         *(undefined4 *)
          (CONCAT44(neb.super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish._4_4_,
                    (int)neb.super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish) + -4);
    std::vector<int,_std::allocator<int>_>::resize
              (&neb.super_vector<int,_std::allocator<int>_>,
               (long)(this->super_AmrInfo).max_level + 1,(value_type_conflict *)&ratios_vect);
    SetBlockingFactor(this,&neb);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&neb);
  }
  uVar4 = ParmParse::countval(&pp,"blocking_factor_x",-1);
  if (0 < (int)uVar4) {
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    uVar12 = 0;
    ParmParse::getarr(&pp,"blocking_factor_x",&neb.super_vector<int,_std::allocator<int>_>,0,-1);
    iVar5 = (this->super_AmrInfo).max_level;
    uVar8 = iVar5 + 1;
    if ((int)uVar4 <= (int)uVar8) {
      uVar8 = uVar4;
    }
    pIVar10 = (this->super_AmrInfo).blocking_factor.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar14 = 0;
    if (0 < (int)uVar8) {
      uVar14 = (ulong)uVar8;
    }
    for (; uVar14 != uVar12; uVar12 = uVar12 + 1) {
      pIVar10->vect[0] =
           *(int *)(CONCAT44(neb.super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             (int)neb.super_vector<int,_std::allocator<int>_>.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) + uVar12 * 4);
      pIVar10 = pIVar10 + 1;
    }
    uVar12 = (long)iVar5 + 1;
    if ((long)(ulong)uVar4 <= (long)uVar12) {
      uVar12 = (ulong)uVar4;
    }
    pIVar10 = (this_00->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start + uVar12;
    for (; (long)uVar12 <= (long)(this->super_AmrInfo).max_level; uVar12 = uVar12 + 1) {
      pIVar10->vect[0] =
           *(int *)(CONCAT44(neb.super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             (int)neb.super_vector<int,_std::allocator<int>_>.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) + -4 + (long)(int)uVar8 * 4);
      pIVar10 = pIVar10 + 1;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&neb);
  }
  uVar4 = ParmParse::countval(&pp,"blocking_factor_y",-1);
  if (0 < (int)uVar4) {
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    uVar12 = 0;
    ParmParse::getarr(&pp,"blocking_factor_y",&neb.super_vector<int,_std::allocator<int>_>,0,-1);
    iVar5 = (this->super_AmrInfo).max_level;
    uVar8 = iVar5 + 1;
    if ((int)uVar4 <= (int)uVar8) {
      uVar8 = uVar4;
    }
    uVar14 = 0;
    if (0 < (int)uVar8) {
      uVar14 = (ulong)uVar8;
    }
    piVar13 = ((this->super_AmrInfo).blocking_factor.
               super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
               super__Vector_impl_data._M_start)->vect + 1;
    for (; uVar14 != uVar12; uVar12 = uVar12 + 1) {
      *piVar13 = *(int *)(CONCAT44(neb.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   (int)neb.super_vector<int,_std::allocator<int>_>.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) + uVar12 * 4);
      piVar13 = piVar13 + 3;
    }
    uVar12 = (long)iVar5 + 1;
    if ((long)(ulong)uVar4 <= (long)uVar12) {
      uVar12 = (ulong)uVar4;
    }
    piVar13 = (this_00->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12].vect + 1;
    for (; (long)uVar12 <= (long)(this->super_AmrInfo).max_level; uVar12 = uVar12 + 1) {
      *piVar13 = *(int *)(CONCAT44(neb.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   (int)neb.super_vector<int,_std::allocator<int>_>.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) + -4 +
                         (long)(int)uVar8 * 4);
      piVar13 = piVar13 + 3;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&neb);
  }
  uVar4 = ParmParse::countval(&pp,"blocking_factor_z",-1);
  if (0 < (int)uVar4) {
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    uVar12 = 0;
    ParmParse::getarr(&pp,"blocking_factor_z",&neb.super_vector<int,_std::allocator<int>_>,0,-1);
    iVar5 = (this->super_AmrInfo).max_level;
    uVar8 = iVar5 + 1;
    if ((int)uVar4 <= (int)uVar8) {
      uVar8 = uVar4;
    }
    uVar14 = 0;
    if (0 < (int)uVar8) {
      uVar14 = (ulong)uVar8;
    }
    piVar13 = ((this->super_AmrInfo).blocking_factor.
               super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
               super__Vector_impl_data._M_start)->vect + 2;
    for (; uVar14 != uVar12; uVar12 = uVar12 + 1) {
      *piVar13 = *(int *)(CONCAT44(neb.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   (int)neb.super_vector<int,_std::allocator<int>_>.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) + uVar12 * 4);
      piVar13 = piVar13 + 3;
    }
    uVar12 = (long)iVar5 + 1;
    if ((long)(ulong)uVar4 <= (long)uVar12) {
      uVar12 = (ulong)uVar4;
    }
    piVar13 = (this_00->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12].vect + 2;
    for (; (long)uVar12 <= (long)(this->super_AmrInfo).max_level; uVar12 = uVar12 + 1) {
      *piVar13 = *(int *)(CONCAT44(neb.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   (int)neb.super_vector<int,_std::allocator<int>_>.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) + -4 +
                         (long)(int)uVar8 * 4);
      piVar13 = piVar13 + 3;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&neb);
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&ratios_vect.super_vector<int,_std::allocator<int>_>,3,(allocator_type *)&neb);
  piVar13 = (n_cell_in->super_vector<int,_std::allocator<int>_>).
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (*piVar13 == -1) {
    ParmParse::getarr(&pp,"n_cell",&ratios_vect.super_vector<int,_std::allocator<int>_>,0,3);
    puVar7 = (undefined8 *)
             CONCAT44(ratios_vect.super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start._4_4_,
                      ratios_vect.super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start._0_4_);
  }
  else {
    puVar7 = (undefined8 *)
             CONCAT44(ratios_vect.super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start._4_4_,
                      ratios_vect.super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start._0_4_);
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      *(int *)((long)puVar7 + lVar9 * 4) = piVar13[lVar9];
    }
  }
  neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = *(int *)(puVar7 + 1) + -1;
  neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = (int)*puVar7 + -1;
  neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = (int)((ulong)*puVar7 >> 0x20) + -1;
  neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  uVar12 = (ulong)(uint)(this->super_AmrInfo).max_level;
  lVar9 = 8;
  lVar16 = 0;
  for (lVar11 = 0; lVar11 <= (int)uVar12; lVar11 = lVar11 + 1) {
    Geometry::define((Geometry *)
                     ((long)(((this->geom).
                              super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              _M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset +
                     lVar16 + 0xfffffffffffffff8U),(Box *)&neb,rb,coord,is_per);
    uVar12 = (ulong)(this->super_AmrInfo).max_level;
    if (lVar11 < (long)uVar12) {
      pIVar10 = (this_03->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar5 = *(int *)((long)pIVar10->vect + lVar9 + -8);
      if (((iVar5 != 1) || (*(int *)((long)pIVar10->vect + lVar9 + -4) != 1)) ||
         (*(int *)((long)pIVar10->vect + lVar9) != 1)) {
        neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ =
             iVar5 * (int)neb.super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
        neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_start._4_4_ =
             neb.super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
             _4_4_ * *(int *)((long)pIVar10->vect + lVar9 + -4);
        neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ =
             (int)neb.super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish * *(int *)((long)pIVar10->vect + lVar9);
        neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish._4_4_ =
             (neb.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish._4_4_ + 1) * *(int *)((long)pIVar10->vect + lVar9 + -8) + -1;
        neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             ((int)neb.super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_end_of_storage + 1) * *(int *)((long)pIVar10->vect + lVar9 + -4) + -1;
        neb.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             (neb.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ + 1) * *(int *)((long)pIVar10->vect + lVar9) + -1;
      }
    }
    lVar16 = lVar16 + 200;
    lVar9 = lVar9 + 0xc;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&ratios_vect);
  ParmParse::queryAdd<bool,_0>(&pp,"refine_grid_layout",&(this->super_AmrInfo).refine_grid_layout);
  bVar1 = (this->super_AmrInfo).refine_grid_layout;
  (this->super_AmrInfo).refine_grid_layout_dims.vect[0] = (uint)bVar1;
  (this->super_AmrInfo).refine_grid_layout_dims.vect[1] = (uint)bVar1;
  (this->super_AmrInfo).refine_grid_layout_dims.vect[2] = (uint)bVar1;
  ParmParse::queryAdd<int,_0>
            (&pp,"refine_grid_layout_x",(this->super_AmrInfo).refine_grid_layout_dims.vect);
  ParmParse::queryAdd<int,_0>
            (&pp,"refine_grid_layout_y",(this->super_AmrInfo).refine_grid_layout_dims.vect + 1);
  ParmParse::queryAdd<int,_0>
            (&pp,"refine_grid_layout_z",(this->super_AmrInfo).refine_grid_layout_dims.vect + 2);
  (this->super_AmrInfo).refine_grid_layout =
       ((this->super_AmrInfo).refine_grid_layout_dims.vect[1] != 0 ||
       (this->super_AmrInfo).refine_grid_layout_dims.vect[0] != 0) ||
       (this->super_AmrInfo).refine_grid_layout_dims.vect[2] != 0;
  ParmParse::queryAdd<bool,_0>(&pp,"check_input",&(this->super_AmrInfo).check_input);
  *(undefined4 *)&(this->super_AmrInfo).field_0x8c = 0xffffffff;
  if ((this->super_AmrInfo).check_input == true) {
    checkInput(this);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&pp);
  return;
}

Assistant:

void
AmrMesh::InitAmrMesh (int max_level_in, const Vector<int>& n_cell_in,
                      Vector<IntVect> a_refrat, const RealBox* rb,
                      int coord, const int* is_per)
{
    ParmParse pp("amr");

    pp.queryAdd("v",verbose);

    if (max_level_in == -1) {
       pp.get("max_level", max_level);
    } else {
       max_level = max_level_in;
    }

    int nlev = max_level + 1;

    blocking_factor.resize(nlev);
    max_grid_size.resize(nlev);
    n_error_buf.resize(nlev);

    geom.resize(nlev);
    dmap.resize(nlev);
    grids.resize(nlev);

    for (int i = 0; i < nlev; ++i) {
        n_error_buf[i]     = IntVect{AMREX_D_DECL(1,1,1)};
        blocking_factor[i] = IntVect{AMREX_D_DECL(8,8,8)};
        max_grid_size[i]   = (AMREX_SPACEDIM == 2) ? IntVect{AMREX_D_DECL(128,128,128)}
                                                   : IntVect{AMREX_D_DECL(32,32,32)};
    }

    // Make the default ref_ratio = 2 for all levels.
    ref_ratio.resize(max_level);
    for (int i = 0; i < max_level; ++i)
    {
      ref_ratio[i] = 2 * IntVect::TheUnitVector();
    }

    pp.queryAdd("n_proper",n_proper);
    pp.queryAdd("grid_eff",grid_eff);
    int cnt = pp.countval("n_error_buf");
    if (cnt > 0) {
        Vector<int> neb;
        pp.getarr("n_error_buf",neb);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            n_error_buf[i] = IntVect(neb[i]);
        }
        for (int i = n; i <= max_level; ++i) {
            n_error_buf[i] = IntVect(neb[cnt-1]);
        }
    }

    cnt = pp.countval("n_error_buf_x");
    if (cnt > 0) {
        int idim = 0;
        Vector<int> neb;
        pp.getarr("n_error_buf_x",neb);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            n_error_buf[i][idim] = neb[i];
        }
        for (int i = n; i <= max_level; ++i) {
            n_error_buf[i][idim] = neb[n-1];
        }
    }

#if (AMREX_SPACEDIM > 1)
    cnt = pp.countval("n_error_buf_y");
    if (cnt > 0) {
        int idim = 1;
        Vector<int> neb;
        pp.getarr("n_error_buf_y",neb);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            n_error_buf[i][idim] = neb[i];
        }
        for (int i = n; i <= max_level; ++i) {
            n_error_buf[i][idim] = neb[n-1];
        }
    }
#endif

#if (AMREX_SPACEDIM == 3)
    cnt = pp.countval("n_error_buf_z");
    if (cnt > 0) {
        int idim = 2;
        Vector<int> neb;
        pp.getarr("n_error_buf_z",neb);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            n_error_buf[i][idim] = neb[i];
        }
        for (int i = n; i <= max_level; ++i) {
            n_error_buf[i][idim] = neb[n-1];
        }
    }
#endif

    // Read in the refinement ratio IntVects as integer AMREX_SPACEDIM-tuples.
    if (max_level > 0)
    {
        const int nratios_vect = max_level*AMREX_SPACEDIM;

        Vector<int> ratios_vect(nratios_vect);

        int got_vect = pp.queryarr("ref_ratio_vect",ratios_vect,0,nratios_vect);

        Vector<int> ratios;

        const int got_int = pp.queryarr("ref_ratio",ratios);

        if (got_int == 1 && got_vect == 1)
        {
            amrex::Abort("Only input *either* ref_ratio or ref_ratio_vect");
        }
        else if (got_vect == 1)
        {
            int k = 0;
            for (int i = 0; i < max_level; i++)
            {
                for (int n = 0; n < AMREX_SPACEDIM; n++,k++)
                    ref_ratio[i][n] = ratios_vect[k];
            }
        }
        else if (got_int == 1)
        {
            const int ncnt = ratios.size();
            for (int i = 0; i < ncnt && i < max_level; ++i)
            {
                for (int n = 0; n < AMREX_SPACEDIM; n++) {
                    ref_ratio[i][n] = ratios[i];
                }
            }
            for (int i = ncnt; i < max_level; ++i)
            {
                for (int n = 0; n < AMREX_SPACEDIM; n++) {
                    ref_ratio[i][n] = ratios.back();
                }
            }
        }
        else
        {
            if (verbose) {
                amrex::Print() << "Using default ref_ratio = 2 at all levels\n";
            }
        }
    }
    //if sent in, this wins over everything.
    if(a_refrat.size() > 0)
    {
      for (int i = 0; i < max_level; i++)
      {
          ref_ratio[i] = a_refrat[i];
      }
    }

    // Read in max_grid_size.  Use defaults if not explicitly defined.
    cnt = pp.countval("max_grid_size");
    if (cnt > 0) {
        Vector<int> mgs;
        pp.getarr("max_grid_size",mgs);
        int last_mgs = mgs.back();
        mgs.resize(max_level+1,last_mgs);
        SetMaxGridSize(mgs);
    }

    cnt = pp.countval("max_grid_size_x");
    if (cnt > 0) {
        int idim = 0;
        Vector<int> mgs;
        pp.getarr("max_grid_size_x",mgs);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            max_grid_size[i][idim] = mgs[i];
        }
        for (int i = n; i <= max_level; ++i) {
            max_grid_size[i][idim] = mgs[n-1];
        }
    }

#if (AMREX_SPACEDIM > 1)
    cnt = pp.countval("max_grid_size_y");
    if (cnt > 0) {
        int idim = 1;
        Vector<int> mgs;
        pp.getarr("max_grid_size_y",mgs);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            max_grid_size[i][idim] = mgs[i];
        }
        for (int i = n; i <= max_level; ++i) {
            max_grid_size[i][idim] = mgs[n-1];
        }
    }
#endif

#if (AMREX_SPACEDIM == 3)
    cnt = pp.countval("max_grid_size_z");
    if (cnt > 0) {
        int idim = 2;
        Vector<int> mgs;
        pp.getarr("max_grid_size_z",mgs);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            max_grid_size[i][idim] = mgs[i];
        }
        for (int i = n; i <= max_level; ++i) {
            max_grid_size[i][idim] = mgs[n-1];
        }
    }
#endif

    // Read in the blocking_factors.  Use defaults if not explicitly defined.
    cnt = pp.countval("blocking_factor");
    if (cnt > 0) {
        Vector<int> bf;
        pp.getarr("blocking_factor",bf);
        int last_bf = bf.back();
        bf.resize(max_level+1,last_bf);
        SetBlockingFactor(bf);
    }

    cnt = pp.countval("blocking_factor_x");
    if (cnt > 0) {
        int idim = 0;
        Vector<int> bf;
        pp.getarr("blocking_factor_x",bf);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            blocking_factor[i][idim] = bf[i];
        }
        for (int i = n; i <= max_level; ++i) {
            blocking_factor[i][idim] = bf[n-1];
        }
    }

#if (AMREX_SPACEDIM > 1)
    cnt = pp.countval("blocking_factor_y");
    if (cnt > 0) {
        int idim = 1;
        Vector<int> bf;
        pp.getarr("blocking_factor_y",bf);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            blocking_factor[i][idim] = bf[i];
        }
        for (int i = n; i <= max_level; ++i) {
            blocking_factor[i][idim] = bf[n-1];
        }
    }
#endif

#if (AMREX_SPACEDIM == 3)
    cnt = pp.countval("blocking_factor_z");
    if (cnt > 0) {
        int idim = 2;
        Vector<int> bf;
        pp.getarr("blocking_factor_z",bf);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            blocking_factor[i][idim] = bf[i];
        }
        for (int i = n; i <= max_level; ++i) {
            blocking_factor[i][idim] = bf[n-1];
        }
    }
#endif

    // Read computational domain and set geometry.
    {
        Vector<int> n_cell(AMREX_SPACEDIM);
        if (n_cell_in[0] == -1)
        {
            pp.getarr("n_cell",n_cell,0,AMREX_SPACEDIM);
        }
        else
        {
            for (int i = 0; i < AMREX_SPACEDIM; i++) n_cell[i] = n_cell_in[i];
        }

        IntVect lo(IntVect::TheZeroVector()), hi(n_cell);
        hi -= IntVect::TheUnitVector();
        Box index_domain(lo,hi);
        for (int i = 0; i <= max_level; i++)
        {
            geom[i].define(index_domain, rb, coord, is_per);
            if (i < max_level) {
                index_domain.refine(ref_ratio[i]);
            }
        }
    }

    //chop up grids to have the number of grids be no less the number of procs
    {
        pp.queryAdd("refine_grid_layout", refine_grid_layout);

        refine_grid_layout_dims = IntVect(refine_grid_layout);
        AMREX_D_TERM(pp.queryAdd("refine_grid_layout_x", refine_grid_layout_dims[0]);,
                     pp.queryAdd("refine_grid_layout_y", refine_grid_layout_dims[1]);,
                     pp.queryAdd("refine_grid_layout_z", refine_grid_layout_dims[2]));

        refine_grid_layout = refine_grid_layout_dims != 0;
    }

    pp.queryAdd("check_input", check_input);

    finest_level = -1;

    if (check_input) checkInput();
}